

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O0

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeQuad>::~TPZCompElHDivCollapsed
          (TPZCompElHDivCollapsed<pzshape::TPZShapeQuad> *this,void **vtt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TPZGeoEl *this_00;
  TPZCompEl *pTVar4;
  TPZCompElSide *pTVar5;
  long *in_RSI;
  TPZCompEl *in_RDI;
  void **in_stack_00000008;
  TPZCompElHDiv<pzshape::TPZShapeQuad> *in_stack_00000010;
  TPZConnect *c_1;
  int cindex_1;
  TPZInterpolatedElement *intel;
  TPZCompEl *cel;
  TPZGeoElSide gelsidesmall;
  TPZCompElSide celsidesmall;
  int64_t el;
  int64_t ncel;
  TPZConnect *c;
  int cindex;
  TPZCompElSide largecel;
  TPZStack<TPZCompElSide,_10> celstack;
  TPZGeoElSide gelside;
  int side;
  TPZGeoEl *gel;
  size_t in_stack_00000228;
  char *in_stack_00000230;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  TPZGeoEl *in_stack_fffffffffffffe18;
  TPZCompElSide *pTVar6;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  TPZCompElSide *in_stack_fffffffffffffe28;
  TPZCompElSide local_138;
  int64_t local_128;
  long local_120;
  undefined8 local_118;
  undefined4 local_10c;
  TPZCompElSide local_108;
  TPZVec<TPZCompElSide> local_f8 [3];
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  TPZStack<TPZCompElSide,_10> *in_stack_ffffffffffffff88;
  TPZGeoElSide *in_stack_ffffffffffffff90;
  
  *(long *)in_RDI = *in_RSI;
  *(long *)((long)&in_RDI->field_0x0 + *(long *)(*(long *)in_RDI + -0x60)) = in_RSI[0xb];
  this_00 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffe18);
  if ((this_00 != (TPZGeoEl *)0x0) &&
     ((this_00 == (TPZGeoEl *)0x0 || (pTVar4 = TPZGeoEl::Reference(this_00), pTVar4 == in_RDI)))) {
    TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffe18);
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
    TPZStack<TPZCompElSide,_10>::TPZStack
              ((TPZStack<TPZCompElSide,_10> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    TPZGeoElSide::LowerLevelCompElementList2
              ((TPZGeoElSide *)celsidesmall._8_8_,celsidesmall.fEl._4_4_);
    bVar1 = TPZCompElSide::operator_cast_to_bool(&local_108);
    if (bVar1) {
      local_10c = (**(code **)(*(long *)in_RDI + 0x250))(in_RDI,0,8);
      local_118 = (**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,local_10c);
      TPZConnect::RemoveDepend
                ((TPZConnect *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    }
    TPZGeoElSide::HigherLevelCompElementList3
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
               in_stack_ffffffffffffff80);
    local_120 = TPZVec<TPZCompElSide>::size(local_f8);
    for (local_128 = 0; local_128 < local_120; local_128 = local_128 + 1) {
      pTVar5 = TPZVec<TPZCompElSide>::operator[](local_f8,local_128);
      TPZCompElSide::TPZCompElSide(&local_138,pTVar5);
      TPZCompElSide::Reference(in_stack_fffffffffffffe28);
      iVar2 = TPZGeoElSide::Dimension
                        ((TPZGeoElSide *)
                         CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      iVar3 = (**(code **)(*(long *)this_00 + 0x210))();
      if (iVar2 == iVar3) {
        pTVar4 = TPZCompElSide::Element(&local_138);
        if (pTVar4 == (TPZCompEl *)0x0) {
          pTVar5 = (TPZCompElSide *)0x0;
        }
        else {
          pTVar5 = (TPZCompElSide *)
                   __dynamic_cast(pTVar4,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0);
        }
        in_stack_fffffffffffffe28 = pTVar5;
        if (pTVar5 == (TPZCompElSide *)0x0) {
          pzinternal::DebugStopImpl(in_stack_00000230,in_stack_00000228);
        }
        pTVar6 = pTVar5;
        iVar2 = TPZCompElSide::Side(&local_138);
        in_stack_fffffffffffffe14 = (*(code *)pTVar6->fEl[0xe].fIntegrationRule)(pTVar6,0,iVar2);
        (*(code *)pTVar5->fEl[4].fMesh)(pTVar5,in_stack_fffffffffffffe14);
        TPZConnect::RemoveDepend
                  ((TPZConnect *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      }
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1a64dec);
    }
    if (this_00 != (TPZGeoEl *)0x0) {
      TPZGeoEl::ResetReference(this_00);
    }
    TPZStack<TPZCompElSide,_10>::~TPZStack((TPZStack<TPZCompElSide,_10> *)0x1a64e3f);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1a64e4c);
  }
  TPZCompElHDiv<pzshape::TPZShapeQuad>::~TPZCompElHDiv(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

TPZCompElHDivCollapsed<TSHAPE>::~TPZCompElHDivCollapsed(){
    TPZGeoEl *gel = this->Reference();
    if(!gel) return;
    if (gel && gel->Reference() != this) {
        return;
    }
    int side = TSHAPE::NSides-1;
    TPZGeoElSide gelside(this->Reference(),side);
    TPZStack<TPZCompElSide> celstack;
    TPZCompElSide largecel = gelside.LowerLevelCompElementList2(0);
    if (largecel) {
        int cindex = this->SideConnectLocId(0, side);
        TPZConnect &c = this->Connect(cindex);
        c.RemoveDepend();
    }
    gelside.HigherLevelCompElementList3(celstack, 0, 1);
    int64_t ncel = celstack.size();
    for (int64_t el=0; el<ncel; el++) {
        TPZCompElSide celsidesmall = celstack[el];
        TPZGeoElSide gelsidesmall = celsidesmall.Reference();
        if (gelsidesmall.Dimension() != gel->Dimension()) {
            continue;
        }
        TPZCompEl *cel = celsidesmall.Element();
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);
        if (!intel) {
            DebugStop();
        }
        int cindex = intel->SideConnectLocId(0, celsidesmall.Side());
        TPZConnect &c = intel->Connect(cindex);
        c.RemoveDepend();
    }
    if (gel){
        gel->ResetReference();
    }

}